

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

bool is_affected_room(ROOM_INDEX_DATA *room,int sn)

{
  bool bVar1;
  ROOM_AFFECT_DATA *pRVar2;
  
  if (room == (ROOM_INDEX_DATA *)0x0) {
    return false;
  }
  pRVar2 = (ROOM_AFFECT_DATA *)&room->affected;
  do {
    pRVar2 = pRVar2->next;
    bVar1 = pRVar2 != (ROOM_AFFECT_DATA *)0x0;
    if (pRVar2 == (ROOM_AFFECT_DATA *)0x0) {
      return bVar1;
    }
  } while (pRVar2->type != sn);
  return bVar1;
}

Assistant:

bool is_affected_room(ROOM_INDEX_DATA *room, int sn)
{
	ROOM_AFFECT_DATA *paf;

	if (!room)
		return false;

	for (paf = room->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->type == sn)
			return true;
	}

	return false;
}